

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O3

bool __thiscall MT32Emu::Part::abortFirstPoly(Part *this,uint key)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  Poly *this_00;
  undefined8 in_RCX;
  
  bVar2 = (byte)in_RCX;
  this_00 = (this->activePolys).firstPoly;
  do {
    if (this_00 == (Poly *)0x0) {
      bVar1 = 0;
LAB_00181edf:
      return (bool)(bVar1 & bVar2);
    }
    uVar3 = Poly::getKey(this_00);
    if (uVar3 == key) {
      bVar2 = Poly::startAbort(this_00);
      bVar1 = 1;
      goto LAB_00181edf;
    }
    this_00 = Poly::getNext(this_00);
    bVar2 = (byte)in_RCX;
  } while( true );
}

Assistant:

Poly *PolyList::getFirst() const {
	return firstPoly;
}